

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeframe_utils.c
# Opt level: O0

void av1_restore_context(MACROBLOCK *x,RD_SEARCH_MACROBLOCK_CONTEXT *ctx,int mi_row,int mi_col,
                        BLOCK_SIZE bsize,int num_planes)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  long lVar5;
  int in_ECX;
  uint in_EDX;
  long in_RSI;
  long in_RDI;
  byte in_R8B;
  int in_R9D;
  int tx_row;
  int tx_col;
  int mi_height;
  int mi_width;
  int num_4x4_blocks_high;
  int num_4x4_blocks_wide;
  int p;
  MACROBLOCKD *xd;
  int local_2c;
  
  lVar5 = in_RDI + 0x1a0;
  bVar1 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[in_R8B];
  bVar2 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[in_R8B];
  bVar3 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[in_R8B];
  bVar4 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[in_R8B];
  for (local_2c = 0; local_2c < in_R9D; local_2c = local_2c + 1) {
    memcpy((void *)(*(long *)(in_RDI + 0x20c0 + (long)local_2c * 8) +
                   (long)(in_ECX >>
                         ((byte)*(undefined4 *)(lVar5 + (long)local_2c * 0xa30 + 0x14) & 0x1f))),
           (void *)(in_RSI + (int)((uint)bVar1 * local_2c)),
           (ulong)(long)(int)(uint)bVar1 >>
           ((byte)*(undefined4 *)(lVar5 + (long)local_2c * 0xa30 + 0x14) & 0x3f));
    memcpy((void *)(in_RDI + 0x20d8 + (long)local_2c * 0x20 +
                   (long)((int)(in_EDX & 0x1f) >>
                         ((byte)*(undefined4 *)(lVar5 + (long)local_2c * 0xa30 + 0x18) & 0x1f))),
           (void *)(in_RSI + 0x60 + (long)(int)((uint)bVar2 * local_2c)),
           (ulong)(long)(int)(uint)bVar2 >>
           ((byte)*(undefined4 *)(lVar5 + (long)local_2c * 0xa30 + 0x18) & 0x3f));
  }
  memcpy((void *)(*(long *)(in_RDI + 0x2138) + (long)in_ECX),(void *)(in_RSI + 0xc0),
         (long)(int)(uint)bVar3);
  memcpy((void *)(in_RDI + 0x2140 + (long)(int)(in_EDX & 0x1f)),(void *)(in_RSI + 0xe0),
         (long)(int)(uint)bVar4);
  *(undefined8 *)(in_RDI + 0x2160) = *(undefined8 *)(in_RSI + 0x100);
  *(undefined8 *)(in_RDI + 0x2168) = *(undefined8 *)(in_RSI + 0x108);
  memcpy(*(void **)(in_RDI + 0x2160),(void *)(in_RSI + 0x110),(long)(int)(uint)bVar3);
  memcpy(*(void **)(in_RDI + 0x2168),(void *)(in_RSI + 0x130),(long)(int)(uint)bVar4);
  return;
}

Assistant:

void av1_restore_context(MACROBLOCK *x, const RD_SEARCH_MACROBLOCK_CONTEXT *ctx,
                         int mi_row, int mi_col, BLOCK_SIZE bsize,
                         const int num_planes) {
  MACROBLOCKD *xd = &x->e_mbd;
  int p;
  const int num_4x4_blocks_wide = mi_size_wide[bsize];
  const int num_4x4_blocks_high = mi_size_high[bsize];
  int mi_width = mi_size_wide[bsize];
  int mi_height = mi_size_high[bsize];
  for (p = 0; p < num_planes; p++) {
    int tx_col = mi_col;
    int tx_row = mi_row & MAX_MIB_MASK;
    memcpy(
        xd->above_entropy_context[p] + (tx_col >> xd->plane[p].subsampling_x),
        ctx->a + num_4x4_blocks_wide * p,
        (sizeof(ENTROPY_CONTEXT) * num_4x4_blocks_wide) >>
            xd->plane[p].subsampling_x);
    memcpy(xd->left_entropy_context[p] + (tx_row >> xd->plane[p].subsampling_y),
           ctx->l + num_4x4_blocks_high * p,
           (sizeof(ENTROPY_CONTEXT) * num_4x4_blocks_high) >>
               xd->plane[p].subsampling_y);
  }
  memcpy(xd->above_partition_context + mi_col, ctx->sa,
         sizeof(*xd->above_partition_context) * mi_width);
  memcpy(xd->left_partition_context + (mi_row & MAX_MIB_MASK), ctx->sl,
         sizeof(xd->left_partition_context[0]) * mi_height);
  xd->above_txfm_context = ctx->p_ta;
  xd->left_txfm_context = ctx->p_tl;
  memcpy(xd->above_txfm_context, ctx->ta,
         sizeof(*xd->above_txfm_context) * mi_width);
  memcpy(xd->left_txfm_context, ctx->tl,
         sizeof(*xd->left_txfm_context) * mi_height);
}